

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

RandomSampler *
pbrt::RandomSampler::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  int *piVar2;
  RandomSampler *pRVar3;
  allocator<char> local_49;
  int ns;
  int seed;
  string local_40;
  Allocator alloc_local;
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"pixelsamples",(allocator<char> *)&seed);
  iVar1 = ParameterDictionary::GetOneInt(parameters,&local_40,4);
  std::__cxx11::string::~string((string *)&local_40);
  ns = iVar1;
  if (*(char *)(Options + 0x1c) == '\x01') {
    piVar2 = pstd::optional<int>::value((optional<int> *)(Options + 0x18));
    ns = *piVar2;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"seed",&local_49);
  iVar1 = ParameterDictionary::GetOneInt(parameters,&local_40,*(int *)(Options + 4));
  std::__cxx11::string::~string((string *)&local_40);
  seed = iVar1;
  pRVar3 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::RandomSampler,int&,int&>
                     (&alloc_local,&ns,&seed);
  return pRVar3;
}

Assistant:

RandomSampler *RandomSampler::Create(const ParameterDictionary &parameters,
                                     const FileLoc *loc, Allocator alloc) {
    int ns = parameters.GetOneInt("pixelsamples", 4);
    if (Options->pixelSamples)
        ns = *Options->pixelSamples;
    int seed = parameters.GetOneInt("seed", Options->seed);
    return alloc.new_object<RandomSampler>(ns, seed);
}